

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

int32 mkvmuxer::SerializeFloat(IMkvWriter *writer,float f)

{
  int iVar1;
  undefined8 *in_RDI;
  uint in_XMM0_Da;
  int32 status;
  uint8 byte;
  int32 bit_count;
  int32 byte_count;
  int32 i;
  U32 value;
  undefined1 local_25;
  int local_24;
  int local_20;
  int local_1c;
  uint local_18;
  undefined8 *local_10;
  int32 local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = -1;
  }
  else {
    local_18 = in_XMM0_Da;
    local_10 = in_RDI;
    for (local_1c = 1; local_1c < 5; local_1c = local_1c + 1) {
      local_20 = 4 - local_1c;
      local_24 = local_20 * 8;
      local_25 = (undefined1)(local_18 >> ((byte)local_24 & 0x1f));
      iVar1 = (**(code **)*local_10)(local_10,&local_25,1);
      if (iVar1 < 0) {
        return iVar1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int32 SerializeFloat(IMkvWriter* writer, float f) {
  if (!writer)
    return -1;

  assert(sizeof(uint32) == sizeof(float));
  // This union is merely used to avoid a reinterpret_cast from float& to
  // uint32& which will result in violation of strict aliasing.
  union U32 {
    uint32 u32;
    float f;
  } value;
  value.f = f;

  for (int32 i = 1; i <= 4; ++i) {
    const int32 byte_count = 4 - i;
    const int32 bit_count = byte_count * 8;

    const uint8 byte = static_cast<uint8>(value.u32 >> bit_count);

    const int32 status = writer->Write(&byte, 1);

    if (status < 0)
      return status;
  }

  return 0;
}